

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
          (KNearestNeighborsClassifier *this,KNearestNeighborsClassifier *from)

{
  uint32 uVar1;
  void *pvVar2;
  NearestNeighborsIndex *from_00;
  Int64Parameter *from_01;
  NearestNeighborsIndex *this_00;
  Int64Parameter *this_01;
  StringVector *this_02;
  Int64Vector *this_03;
  StringVector *from_02;
  Int64Vector *from_03;
  UniformWeighting *this_04;
  InverseDistanceWeighting *this_05;
  UniformWeighting *from_04;
  InverseDistanceWeighting *from_05;
  DefaultClassLabelUnion DVar3;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__KNearestNeighborsClassifier_00722170;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->nearestneighborsindex_;
  if (from_00 == (NearestNeighborsIndex *)0x0 ||
      from == (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    this_00 = (NearestNeighborsIndex *)0x0;
  }
  else {
    this_00 = (NearestNeighborsIndex *)operator_new(0x50);
    NearestNeighborsIndex::NearestNeighborsIndex(this_00,from_00);
  }
  this->nearestneighborsindex_ = this_00;
  from_01 = from->numberofneighbors_;
  if (from_01 == (Int64Parameter *)0x0 ||
      from == (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    this_01 = (Int64Parameter *)0x0;
  }
  else {
    this_01 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_01,from_01);
  }
  this->numberofneighbors_ = this_01;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x65) {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 0x65;
    this_03 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_03);
    (this->ClassLabels_).int64classlabels_ = this_03;
    if (from->_oneof_case_[0] == 0x65) {
      from_03 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      from_03 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_03,from_03);
  }
  else if (from->_oneof_case_[0] == 100) {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 100;
    this_02 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_02);
    (this->ClassLabels_).stringclasslabels_ = this_02;
    if (from->_oneof_case_[0] == 100) {
      from_02 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_02 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_02,from_02);
  }
  this->_oneof_case_[1] = 0;
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0x6f) {
    if (uVar1 == 0x6f) {
      DVar3 = from->DefaultClassLabel_;
    }
    else {
      DVar3.defaultint64label_ = 0;
    }
    clear_DefaultClassLabel(this);
    this->_oneof_case_[1] = 0x6f;
    this->DefaultClassLabel_ = DVar3;
  }
  else if (uVar1 == 0x6e) {
    DVar3 = (DefaultClassLabelUnion)
            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if (uVar1 == 0x6e) {
      DVar3 = from->DefaultClassLabel_;
    }
    clear_DefaultClassLabel(this);
    this->_oneof_case_[1] = 0x6e;
    this->DefaultClassLabel_ =
         (DefaultClassLabelUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->DefaultClassLabel_).defaultstringlabel_,(string *)DVar3);
  }
  this->_oneof_case_[2] = 0;
  if (from->_oneof_case_[2] == 0xd2) {
    clear_WeightingScheme(this);
    this->_oneof_case_[2] = 0xd2;
    this_05 = (InverseDistanceWeighting *)operator_new(0x18);
    InverseDistanceWeighting::InverseDistanceWeighting(this_05);
    (this->WeightingScheme_).inversedistanceweighting_ = this_05;
    if (from->_oneof_case_[2] == 0xd2) {
      from_05 = (from->WeightingScheme_).inversedistanceweighting_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_05 = (InverseDistanceWeighting *)&_InverseDistanceWeighting_default_instance_;
    }
    InverseDistanceWeighting::MergeFrom(this_05,from_05);
  }
  else if (from->_oneof_case_[2] == 200) {
    clear_WeightingScheme(this);
    this->_oneof_case_[2] = 200;
    this_04 = (UniformWeighting *)operator_new(0x18);
    UniformWeighting::UniformWeighting(this_04);
    (this->WeightingScheme_).uniformweighting_ = this_04;
    if (from->_oneof_case_[2] == 200) {
      from_04 = (from->WeightingScheme_).uniformweighting_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_04 = (UniformWeighting *)&_UniformWeighting_default_instance_;
    }
    UniformWeighting::MergeFrom(this_04,from_04);
  }
  return;
}

Assistant:

KNearestNeighborsClassifier::KNearestNeighborsClassifier(const KNearestNeighborsClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_nearestneighborsindex()) {
    nearestneighborsindex_ = new ::CoreML::Specification::NearestNeighborsIndex(*from.nearestneighborsindex_);
  } else {
    nearestneighborsindex_ = NULL;
  }
  if (from.has_numberofneighbors()) {
    numberofneighbors_ = new ::CoreML::Specification::Int64Parameter(*from.numberofneighbors_);
  } else {
    numberofneighbors_ = NULL;
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  clear_has_DefaultClassLabel();
  switch (from.DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      set_defaultstringlabel(from.defaultstringlabel());
      break;
    }
    case kDefaultInt64Label: {
      set_defaultint64label(from.defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  clear_has_WeightingScheme();
  switch (from.WeightingScheme_case()) {
    case kUniformWeighting: {
      mutable_uniformweighting()->::CoreML::Specification::UniformWeighting::MergeFrom(from.uniformweighting());
      break;
    }
    case kInverseDistanceWeighting: {
      mutable_inversedistanceweighting()->::CoreML::Specification::InverseDistanceWeighting::MergeFrom(from.inversedistanceweighting());
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.KNearestNeighborsClassifier)
}